

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-passwd.c
# Opt level: O0

int run_test_get_group(void)

{
  int iVar1;
  size_t sVar2;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  size_t len;
  uv_group_t grp;
  uv_passwd_t pwd;
  
  iVar1 = uv_os_get_passwd((uv_passwd_t *)&grp.members);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
            ,0xb8,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_os_get_group((uv_group_t *)&len,(uv_uid_t)pwd.uid);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
            ,0xc1,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((char *)pwd.uid != grp.groupname) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
            ,0xc2,"pwd.gid","==","grp.gid",pwd.uid,"==",grp.groupname);
    abort();
  }
  sVar2 = strlen((char *)len);
  if ((long)sVar2 < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
            ,0xc5,"len",">","0",sVar2,">",0);
    abort();
  }
  uv_os_free_group((uv_group_t *)&len);
  uv_os_free_passwd((uv_passwd_t *)&grp.members);
  iVar1 = uv_os_get_group((uv_group_t *)0x0,(uv_uid_t)pwd.uid);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-passwd.c"
            ,0xd1,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(get_group) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  uv_passwd_t pwd;
  uv_group_t grp;
  size_t len;
  int r;

  r = uv_os_get_passwd(&pwd);
  ASSERT_OK(r);

  r = uv_os_get_group(&grp, pwd.gid);

#ifdef _WIN32
  ASSERT_EQ(r, UV_ENOTSUP);
  (void) &len;

#else
  ASSERT_OK(r);
  ASSERT_EQ(pwd.gid, grp.gid);

  len = strlen(grp.groupname);
  ASSERT_GT(len, 0);

  uv_os_free_group(&grp);
#endif

  uv_os_free_passwd(&pwd);

  /* Test invalid input */
  r = uv_os_get_group(NULL, pwd.gid);
#ifdef _WIN32
  ASSERT_EQ(r, UV_ENOTSUP);
#else
  ASSERT_EQ(r, UV_EINVAL);
#endif

  return 0;
}